

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::_load_cimg
          (CImgList<unsigned_char> *this,FILE *file,char *filename)

{
  int iVar1;
  FILE *__stream;
  CImgArgumentException *this_00;
  CImgIOException *pCVar2;
  ulong uVar3;
  uchar *puVar4;
  char *pcVar5;
  ulong uVar6;
  CImg<unsigned_char> *pCVar7;
  char *pcVar8;
  undefined8 uVar9;
  uint C;
  uint D;
  uint H;
  uint W;
  CImg<bool> raw;
  uint N;
  char *local_b8;
  unsigned_long csiz;
  ulong local_a8;
  undefined8 local_a0;
  CImg<char> tmp;
  CImg<char> str_pixeltype;
  CImg<char> str_endian;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Specified filename is (null).",
               (ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  local_b8 = filename;
  CImg<char>::CImg(&tmp,0x100,1,1,1);
  CImg<char>::CImg(&str_pixeltype,0x100,1,1,1);
  CImg<char>::CImg(&str_endian,0x100,1,1,1);
  uVar3 = 0;
  *str_endian._data = '\0';
  *str_pixeltype._data = '\0';
  *tmp._data = '\0';
  N = 0;
  do {
    while( true ) {
      iVar1 = fgetc(__stream);
      if (0xfe < uVar3 || (iVar1 < 0 || iVar1 == 10)) break;
      tmp._data[uVar3] = (char)iVar1;
      uVar3 = uVar3 + 1;
    }
    tmp._data[uVar3 & 0xffffffff] = '\0';
  } while ((-1 < iVar1) && (uVar3 = 0, *tmp._data == '#'));
  iVar1 = __isoc99_sscanf(tmp._data,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",&N,str_pixeltype._data,
                          str_endian._data);
  if (1 < iVar1) {
    iVar1 = cimg::strncasecmp("little",str_endian._data,6);
    if (iVar1 == 0) {
      local_a0 = (ulong)local_a0._4_4_ << 0x20;
    }
    else {
      iVar1 = cimg::strncasecmp("big",str_endian._data,3);
      local_a0 = CONCAT44(local_a0._4_4_,CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0));
    }
    assign(this,N);
    iVar1 = cimg::strcasecmp("bool",str_pixeltype._data);
    if (iVar1 == 0) {
      for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
        uVar6 = 0;
        while( true ) {
          iVar1 = fgetc(__stream);
          if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
          tmp._data[uVar6] = (char)iVar1;
          uVar6 = uVar6 + 1;
        }
        tmp._data[uVar6] = '\0';
        C = 0;
        D = 0;
        H = 0;
        W = 0;
        csiz = 0;
        iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
        if (iVar1 < 4) {
          pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar8 = "(FILE*)";
          if (local_b8 != (char *)0x0) {
            pcVar8 = local_b8;
          }
          CImgIOException::CImgIOException
                    (pCVar2,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
                     (ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
          __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (D * C * H * W != 0) {
          raw._data = (bool *)0x0;
          raw._width = 0;
          raw._height = 0;
          raw._depth = 0;
          raw._spectrum = 0;
          raw._is_shared = false;
          if (iVar1 == 5) {
            uVar9 = 0x133e14;
            pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar8 = "(FILE*)";
            if (local_b8 != (char *)0x0) {
              pcVar8 = local_b8;
            }
            CImgIOException::CImgIOException
                      (pCVar2,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",pcVar8);
            __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,uVar9);
          }
          pCVar7 = this->_data + uVar3;
          local_a0 = uVar3;
          CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
          puVar4 = pCVar7->_data;
          for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                       (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
              uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
            uVar6 = 0x1800000;
            if (uVar3 < 0x1800000) {
              uVar6 = uVar3;
            }
            CImg<bool>::assign(&raw,(uint)uVar6,1,1,1);
            cimg::fread<bool>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
            for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
              puVar4[uVar6] = raw._data[uVar6];
            }
            puVar4 = puVar4 + uVar6;
          }
          CImg<bool>::~CImg(&raw);
          uVar3 = local_a0;
        }
      }
    }
    else {
      iVar1 = cimg::strcasecmp("unsigned_char",str_pixeltype._data);
      if (iVar1 == 0) {
        for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
          uVar6 = 0;
          while( true ) {
            iVar1 = fgetc(__stream);
            if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
            tmp._data[uVar6] = (char)iVar1;
            uVar6 = uVar6 + 1;
          }
          tmp._data[uVar6] = '\0';
          C = 0;
          D = 0;
          H = 0;
          W = 0;
          csiz = 0;
          iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
          if (iVar1 < 4) {
            pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
            pcVar8 = "(FILE*)";
            if (local_b8 != (char *)0x0) {
              pcVar8 = local_b8;
            }
            CImgIOException::CImgIOException
                      (pCVar2,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                       "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
            __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
          }
          if (D * C * H * W != 0) {
            raw._data = (bool *)0x0;
            raw._width = 0;
            raw._height = 0;
            raw._depth = 0;
            raw._spectrum = 0;
            raw._is_shared = false;
            if (iVar1 == 5) {
              uVar9 = 0x133efa;
              pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
              pcVar8 = "(FILE*)";
              if (local_b8 != (char *)0x0) {
                pcVar8 = local_b8;
              }
              CImgIOException::CImgIOException
                        (pCVar2,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                         "unsigned char",pcVar8);
              __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,uVar9);
            }
            pCVar7 = this->_data + uVar3;
            local_a0 = uVar3;
            CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
            puVar4 = pCVar7->_data;
            for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                         (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
              uVar6 = 0x1800000;
              if (uVar3 < 0x1800000) {
                uVar6 = uVar3;
              }
              CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar6,1,1,1);
              cimg::fread<unsigned_char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
              for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                puVar4[uVar6] = raw._data[uVar6];
              }
              puVar4 = puVar4 + uVar6;
            }
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&raw);
            uVar3 = local_a0;
          }
        }
      }
      else {
        iVar1 = cimg::strcasecmp("uchar",str_pixeltype._data);
        if (iVar1 == 0) {
          for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
            uVar6 = 0;
            while( true ) {
              iVar1 = fgetc(__stream);
              if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
              tmp._data[uVar6] = (char)iVar1;
              uVar6 = uVar6 + 1;
            }
            tmp._data[uVar6] = '\0';
            C = 0;
            D = 0;
            H = 0;
            W = 0;
            csiz = 0;
            iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
            if (iVar1 < 4) {
              pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
              pcVar8 = "(FILE*)";
              if (local_b8 != (char *)0x0) {
                pcVar8 = local_b8;
              }
              CImgIOException::CImgIOException
                        (pCVar2,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                         ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                         "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
              __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
            }
            if (D * C * H * W != 0) {
              raw._data = (bool *)0x0;
              raw._width = 0;
              raw._height = 0;
              raw._depth = 0;
              raw._spectrum = 0;
              raw._is_shared = false;
              if (iVar1 == 5) {
                uVar9 = 0x133fe0;
                pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                pcVar8 = "(FILE*)";
                if (local_b8 != (char *)0x0) {
                  pcVar8 = local_b8;
                }
                CImgIOException::CImgIOException
                          (pCVar2,
                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                           ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                           "unsigned char",pcVar8);
                __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,uVar9);
              }
              pCVar7 = this->_data + uVar3;
              local_a0 = uVar3;
              CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
              puVar4 = pCVar7->_data;
              for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                           (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                  uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                uVar6 = 0x1800000;
                if (uVar3 < 0x1800000) {
                  uVar6 = uVar3;
                }
                CImg<unsigned_char>::assign((CImg<unsigned_char> *)&raw,(uint)uVar6,1,1,1);
                cimg::fread<unsigned_char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
                for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                  puVar4[uVar6] = raw._data[uVar6];
                }
                puVar4 = puVar4 + uVar6;
              }
              CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&raw);
              uVar3 = local_a0;
            }
          }
        }
        else {
          iVar1 = cimg::strcasecmp("char",str_pixeltype._data);
          if (iVar1 == 0) {
            for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
              uVar6 = 0;
              while( true ) {
                iVar1 = fgetc(__stream);
                if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                tmp._data[uVar6] = (char)iVar1;
                uVar6 = uVar6 + 1;
              }
              tmp._data[uVar6] = '\0';
              C = 0;
              D = 0;
              H = 0;
              W = 0;
              csiz = 0;
              iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
              if (iVar1 < 4) {
                pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                pcVar8 = "(FILE*)";
                if (local_b8 != (char *)0x0) {
                  pcVar8 = local_b8;
                }
                CImgIOException::CImgIOException
                          (pCVar2,
                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                           ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                           "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
                __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
              }
              if (D * C * H * W != 0) {
                raw._data = (bool *)0x0;
                raw._width = 0;
                raw._height = 0;
                raw._depth = 0;
                raw._spectrum = 0;
                raw._is_shared = false;
                if (iVar1 == 5) {
                  uVar9 = 0x1340c6;
                  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                  pcVar8 = "(FILE*)";
                  if (local_b8 != (char *)0x0) {
                    pcVar8 = local_b8;
                  }
                  CImgIOException::CImgIOException
                            (pCVar2,
                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                             ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                             "unsigned char",pcVar8);
                  __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,uVar9)
                  ;
                }
                pCVar7 = this->_data + uVar3;
                local_a0 = uVar3;
                CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                puVar4 = pCVar7->_data;
                for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                             (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                    uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                  uVar6 = 0x1800000;
                  if (uVar3 < 0x1800000) {
                    uVar6 = uVar3;
                  }
                  CImg<char>::assign((CImg<char> *)&raw,(uint)uVar6,1,1,1);
                  cimg::fread<char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
                  for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                    puVar4[uVar6] = raw._data[uVar6];
                  }
                  puVar4 = puVar4 + uVar6;
                }
                CImg<char>::~CImg((CImg<char> *)&raw);
                uVar3 = local_a0;
              }
            }
          }
          else {
            iVar1 = cimg::strcasecmp("unsigned_short",str_pixeltype._data);
            if (iVar1 == 0) {
              for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                uVar6 = 0;
                while( true ) {
                  iVar1 = fgetc(__stream);
                  if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                  tmp._data[uVar6] = (char)iVar1;
                  uVar6 = uVar6 + 1;
                }
                tmp._data[uVar6] = '\0';
                C = 0;
                D = 0;
                H = 0;
                W = 0;
                csiz = 0;
                iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                if (iVar1 < 4) {
                  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                  pcVar8 = "(FILE*)";
                  if (local_b8 != (char *)0x0) {
                    pcVar8 = local_b8;
                  }
                  CImgIOException::CImgIOException
                            (pCVar2,
                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                             ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                             "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
                  __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
                }
                if (D * C * H * W != 0) {
                  raw._data = (bool *)0x0;
                  raw._width = 0;
                  raw._height = 0;
                  raw._depth = 0;
                  raw._spectrum = 0;
                  raw._is_shared = false;
                  if (iVar1 == 5) {
                    uVar9 = 0x1341b0;
                    pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                    pcVar8 = "(FILE*)";
                    if (local_b8 != (char *)0x0) {
                      pcVar8 = local_b8;
                    }
                    CImgIOException::CImgIOException
                              (pCVar2,
                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                               "unsigned char",pcVar8);
                    __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,
                                uVar9);
                  }
                  pCVar7 = this->_data + uVar3;
                  local_a8 = uVar3;
                  CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                  puVar4 = pCVar7->_data;
                  for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                               (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                      uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                    uVar6 = 0x1800000;
                    if (uVar3 < 0x1800000) {
                      uVar6 = uVar3;
                    }
                    CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar6,1,1,1);
                    cimg::fread<unsigned_short>
                              ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
                    if ((char)local_a0 != '\0') {
                      cimg::invert_endianness<unsigned_short>
                                ((unsigned_short *)raw._data,
                                 ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                 ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                    }
                    for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                      puVar4[uVar6] = raw._data[uVar6 * 2];
                    }
                    puVar4 = puVar4 + uVar6;
                  }
                  CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&raw);
                  uVar3 = local_a8;
                }
              }
            }
            else {
              iVar1 = cimg::strcasecmp("ushort",str_pixeltype._data);
              if (iVar1 == 0) {
                for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                  uVar6 = 0;
                  while( true ) {
                    iVar1 = fgetc(__stream);
                    if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                    tmp._data[uVar6] = (char)iVar1;
                    uVar6 = uVar6 + 1;
                  }
                  tmp._data[uVar6] = '\0';
                  C = 0;
                  D = 0;
                  H = 0;
                  W = 0;
                  csiz = 0;
                  iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                  if (iVar1 < 4) {
                    pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                    pcVar8 = "(FILE*)";
                    if (local_b8 != (char *)0x0) {
                      pcVar8 = local_b8;
                    }
                    CImgIOException::CImgIOException
                              (pCVar2,
                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                               "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
                    __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
                  }
                  if (D * C * H * W != 0) {
                    raw._data = (bool *)0x0;
                    raw._width = 0;
                    raw._height = 0;
                    raw._depth = 0;
                    raw._spectrum = 0;
                    raw._is_shared = false;
                    if (iVar1 == 5) {
                      uVar9 = 0x134350;
                      pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                      pcVar8 = "(FILE*)";
                      if (local_b8 != (char *)0x0) {
                        pcVar8 = local_b8;
                      }
                      CImgIOException::CImgIOException
                                (pCVar2,
                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                 ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                 "unsigned char",pcVar8);
                      __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,
                                  uVar9);
                    }
                    pCVar7 = this->_data + uVar3;
                    local_a8 = uVar3;
                    CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                    puVar4 = pCVar7->_data;
                    for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                 (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                        uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                      uVar6 = 0x1800000;
                      if (uVar3 < 0x1800000) {
                        uVar6 = uVar3;
                      }
                      CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar6,1,1,1);
                      cimg::fread<unsigned_short>
                                ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream
                                );
                      if ((char)local_a0 != '\0') {
                        cimg::invert_endianness<unsigned_short>
                                  ((unsigned_short *)raw._data,
                                   ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                   ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                      }
                      for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                        puVar4[uVar6] = raw._data[uVar6 * 2];
                      }
                      puVar4 = puVar4 + uVar6;
                    }
                    CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&raw);
                    uVar3 = local_a8;
                  }
                }
              }
              else {
                iVar1 = cimg::strcasecmp("short",str_pixeltype._data);
                if (iVar1 == 0) {
                  for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                    uVar6 = 0;
                    while( true ) {
                      iVar1 = fgetc(__stream);
                      if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                      tmp._data[uVar6] = (char)iVar1;
                      uVar6 = uVar6 + 1;
                    }
                    tmp._data[uVar6] = '\0';
                    C = 0;
                    D = 0;
                    H = 0;
                    W = 0;
                    csiz = 0;
                    iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                    if (iVar1 < 4) {
                      pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                      pcVar8 = "(FILE*)";
                      if (local_b8 != (char *)0x0) {
                        pcVar8 = local_b8;
                      }
                      CImgIOException::CImgIOException
                                (pCVar2,
                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                 ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                 "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8);
                      __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException);
                    }
                    if (D * C * H * W != 0) {
                      raw._data = (bool *)0x0;
                      raw._width = 0;
                      raw._height = 0;
                      raw._depth = 0;
                      raw._spectrum = 0;
                      raw._is_shared = false;
                      if (iVar1 == 5) {
                        uVar9 = 0x13443a;
                        pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                        pcVar8 = "(FILE*)";
                        if (local_b8 != (char *)0x0) {
                          pcVar8 = local_b8;
                        }
                        CImgIOException::CImgIOException
                                  (pCVar2,
                                   "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                   ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                   "unsigned char",pcVar8);
                        __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,
                                    uVar9);
                      }
                      pCVar7 = this->_data + uVar3;
                      local_a8 = uVar3;
                      CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                      puVar4 = pCVar7->_data;
                      for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                   (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                          uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                        uVar6 = 0x1800000;
                        if (uVar3 < 0x1800000) {
                          uVar6 = uVar3;
                        }
                        CImg<short>::assign((CImg<short> *)&raw,(uint)uVar6,1,1,1);
                        cimg::fread<short>((short *)raw._data,raw._0_8_ & 0xffffffff,
                                           (FILE *)__stream);
                        if ((char)local_a0 != '\0') {
                          cimg::invert_endianness<short>
                                    ((short *)raw._data,
                                     ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                     ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                        }
                        for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                          puVar4[uVar6] = raw._data[uVar6 * 2];
                        }
                        puVar4 = puVar4 + uVar6;
                      }
                      CImg<short>::~CImg((CImg<short> *)&raw);
                      uVar3 = local_a8;
                    }
                  }
                }
                else {
                  iVar1 = cimg::strcasecmp("unsigned_int",str_pixeltype._data);
                  if (iVar1 == 0) {
                    for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                      uVar6 = 0;
                      while( true ) {
                        iVar1 = fgetc(__stream);
                        if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                        tmp._data[uVar6] = (char)iVar1;
                        uVar6 = uVar6 + 1;
                      }
                      tmp._data[uVar6] = '\0';
                      C = 0;
                      D = 0;
                      H = 0;
                      W = 0;
                      csiz = 0;
                      iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                      if (iVar1 < 4) {
                        pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                        pcVar8 = "(FILE*)";
                        if (local_b8 != (char *)0x0) {
                          pcVar8 = local_b8;
                        }
                        CImgIOException::CImgIOException
                                  (pCVar2,
                                   "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                   ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                   "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,pcVar8)
                        ;
                        __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException)
                        ;
                      }
                      if (D * C * H * W != 0) {
                        raw._data = (bool *)0x0;
                        raw._width = 0;
                        raw._height = 0;
                        raw._depth = 0;
                        raw._spectrum = 0;
                        raw._is_shared = false;
                        if (iVar1 == 5) {
                          uVar9 = 0x134521;
                          pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                          pcVar8 = "(FILE*)";
                          if (local_b8 != (char *)0x0) {
                            pcVar8 = local_b8;
                          }
                          CImgIOException::CImgIOException
                                    (pCVar2,
                                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                     "unsigned char",pcVar8);
                          __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                      CImgException::~CImgException,uVar9);
                        }
                        pCVar7 = this->_data + uVar3;
                        local_a8 = uVar3;
                        CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                        puVar4 = pCVar7->_data;
                        for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                     (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                            uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                          uVar6 = 0x1800000;
                          if (uVar3 < 0x1800000) {
                            uVar6 = uVar3;
                          }
                          CImg<unsigned_int>::assign((CImg<unsigned_int> *)&raw,(uint)uVar6,1,1,1);
                          cimg::fread<unsigned_int>
                                    ((uint *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
                          if ((char)local_a0 != '\0') {
                            cimg::invert_endianness<unsigned_int>
                                      ((uint *)raw._data,
                                       ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                       ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                          }
                          for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                            puVar4[uVar6] = raw._data[uVar6 * 4];
                          }
                          puVar4 = puVar4 + uVar6;
                        }
                        CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&raw);
                        uVar3 = local_a8;
                      }
                    }
                  }
                  else {
                    iVar1 = cimg::strcasecmp("uint",str_pixeltype._data);
                    if (iVar1 == 0) {
                      for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                        uVar6 = 0;
                        while( true ) {
                          iVar1 = fgetc(__stream);
                          if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                          tmp._data[uVar6] = (char)iVar1;
                          uVar6 = uVar6 + 1;
                        }
                        tmp._data[uVar6] = '\0';
                        C = 0;
                        D = 0;
                        H = 0;
                        W = 0;
                        csiz = 0;
                        iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                        if (iVar1 < 4) {
                          pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                          pcVar8 = "(FILE*)";
                          if (local_b8 != (char *)0x0) {
                            pcVar8 = local_b8;
                          }
                          CImgIOException::CImgIOException
                                    (pCVar2,
                                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                     ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,
                                     "unsigned char",(ulong)W,(ulong)H,(ulong)D,(ulong)C,uVar3,
                                     pcVar8);
                          __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                      CImgException::~CImgException);
                        }
                        if (D * C * H * W != 0) {
                          raw._data = (bool *)0x0;
                          raw._width = 0;
                          raw._height = 0;
                          raw._depth = 0;
                          raw._spectrum = 0;
                          raw._is_shared = false;
                          if (iVar1 == 5) {
                            uVar9 = 0x134608;
                            pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                            pcVar8 = "(FILE*)";
                            if (local_b8 != (char *)0x0) {
                              pcVar8 = local_b8;
                            }
                            CImgIOException::CImgIOException
                                      (pCVar2,
                                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                       ,(ulong)this->_width,(ulong)this->_allocated_width,
                                       this->_data,"unsigned char",pcVar8);
                            __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                        CImgException::~CImgException,uVar9);
                          }
                          pCVar7 = this->_data + uVar3;
                          local_a8 = uVar3;
                          CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                          puVar4 = pCVar7->_data;
                          for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                       (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                              uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                            uVar6 = 0x1800000;
                            if (uVar3 < 0x1800000) {
                              uVar6 = uVar3;
                            }
                            CImg<unsigned_int>::assign((CImg<unsigned_int> *)&raw,(uint)uVar6,1,1,1)
                            ;
                            cimg::fread<unsigned_int>
                                      ((uint *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
                            if ((char)local_a0 != '\0') {
                              cimg::invert_endianness<unsigned_int>
                                        ((uint *)raw._data,
                                         ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                         ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                            }
                            for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
                              puVar4[uVar6] = raw._data[uVar6 * 4];
                            }
                            puVar4 = puVar4 + uVar6;
                          }
                          CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&raw);
                          uVar3 = local_a8;
                        }
                      }
                    }
                    else {
                      iVar1 = cimg::strcasecmp("int",str_pixeltype._data);
                      if (iVar1 == 0) {
                        for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                          uVar6 = 0;
                          while( true ) {
                            iVar1 = fgetc(__stream);
                            if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                            tmp._data[uVar6] = (char)iVar1;
                            uVar6 = uVar6 + 1;
                          }
                          tmp._data[uVar6] = '\0';
                          C = 0;
                          D = 0;
                          H = 0;
                          W = 0;
                          csiz = 0;
                          iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                          if (iVar1 < 4) {
                            pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                            pcVar8 = "(FILE*)";
                            if (local_b8 != (char *)0x0) {
                              pcVar8 = local_b8;
                            }
                            CImgIOException::CImgIOException
                                      (pCVar2,
                                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                       ,(ulong)this->_width,(ulong)this->_allocated_width,
                                       this->_data,"unsigned char",(ulong)W,(ulong)H,(ulong)D,
                                       (ulong)C,uVar3,pcVar8);
                            __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                        CImgException::~CImgException);
                          }
                          if (D * C * H * W != 0) {
                            raw._data = (bool *)0x0;
                            raw._width = 0;
                            raw._height = 0;
                            raw._depth = 0;
                            raw._spectrum = 0;
                            raw._is_shared = false;
                            if (iVar1 == 5) {
                              uVar9 = 0x1346f2;
                              pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                              pcVar8 = "(FILE*)";
                              if (local_b8 != (char *)0x0) {
                                pcVar8 = local_b8;
                              }
                              CImgIOException::CImgIOException
                                        (pCVar2,
                                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                         ,(ulong)this->_width,(ulong)this->_allocated_width,
                                         this->_data,"unsigned char",pcVar8);
                              __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                          CImgException::~CImgException,uVar9);
                            }
                            pCVar7 = this->_data + uVar3;
                            local_a8 = uVar3;
                            CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                            puVar4 = pCVar7->_data;
                            for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                         (ulong)pCVar7->_height * (ulong)pCVar7->_width; uVar3 != 0;
                                uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                              uVar6 = 0x1800000;
                              if (uVar3 < 0x1800000) {
                                uVar6 = uVar3;
                              }
                              CImg<int>::assign((CImg<int> *)&raw,(uint)uVar6,1,1,1);
                              cimg::fread<int>((int *)raw._data,raw._0_8_ & 0xffffffff,
                                               (FILE *)__stream);
                              if ((char)local_a0 != '\0') {
                                cimg::invert_endianness<int>
                                          ((int *)raw._data,
                                           ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                           ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                              }
                              for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1)
                              {
                                puVar4[uVar6] = raw._data[uVar6 * 4];
                              }
                              puVar4 = puVar4 + uVar6;
                            }
                            CImg<int>::~CImg((CImg<int> *)&raw);
                            uVar3 = local_a8;
                          }
                        }
                      }
                      else {
                        iVar1 = cimg::strcasecmp("unsigned_long",str_pixeltype._data);
                        if (iVar1 == 0) {
                          for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                            uVar6 = 0;
                            while( true ) {
                              iVar1 = fgetc(__stream);
                              if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                              tmp._data[uVar6] = (char)iVar1;
                              uVar6 = uVar6 + 1;
                            }
                            tmp._data[uVar6] = '\0';
                            C = 0;
                            D = 0;
                            H = 0;
                            W = 0;
                            csiz = 0;
                            iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz);
                            if (iVar1 < 4) {
                              pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                              pcVar8 = "(FILE*)";
                              if (local_b8 != (char *)0x0) {
                                pcVar8 = local_b8;
                              }
                              CImgIOException::CImgIOException
                                        (pCVar2,
                                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                         ,(ulong)this->_width,(ulong)this->_allocated_width,
                                         this->_data,"unsigned char",(ulong)W,(ulong)H,(ulong)D,
                                         (ulong)C,uVar3,pcVar8);
                              __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                          CImgException::~CImgException);
                            }
                            if (D * C * H * W != 0) {
                              raw._data = (bool *)0x0;
                              raw._width = 0;
                              raw._height = 0;
                              raw._depth = 0;
                              raw._spectrum = 0;
                              raw._is_shared = false;
                              if (iVar1 == 5) {
                                uVar9 = 0x1347dc;
                                pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                pcVar8 = "(FILE*)";
                                if (local_b8 != (char *)0x0) {
                                  pcVar8 = local_b8;
                                }
                                CImgIOException::CImgIOException
                                          (pCVar2,
                                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                           ,(ulong)this->_width,(ulong)this->_allocated_width,
                                           this->_data,"unsigned char",pcVar8);
                                __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                            CImgException::~CImgException,uVar9);
                              }
                              pCVar7 = this->_data + uVar3;
                              local_a8 = uVar3;
                              CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                              puVar4 = pCVar7->_data;
                              for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                           (ulong)pCVar7->_height * (ulong)pCVar7->_width;
                                  uVar3 != 0; uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                                uVar6 = 0x1800000;
                                if (uVar3 < 0x1800000) {
                                  uVar6 = uVar3;
                                }
                                CImg<unsigned_long>::assign
                                          ((CImg<unsigned_long> *)&raw,(uint)uVar6,1,1,1);
                                cimg::fread<unsigned_long>
                                          ((unsigned_long *)raw._data,raw._0_8_ & 0xffffffff,
                                           (FILE *)__stream);
                                if ((char)local_a0 != '\0') {
                                  cimg::invert_endianness<unsigned_long>
                                            ((unsigned_long *)raw._data,
                                             ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff) *
                                             ((ulong)raw._0_8_ >> 0x20) * (raw._0_8_ & 0xffffffff));
                                }
                                for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6; uVar6 = uVar6 + 1
                                    ) {
                                  puVar4[uVar6] = raw._data[uVar6 * 8];
                                }
                                puVar4 = puVar4 + uVar6;
                              }
                              CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)&raw);
                              uVar3 = local_a8;
                            }
                          }
                        }
                        else {
                          iVar1 = cimg::strcasecmp("ulong",str_pixeltype._data);
                          if (iVar1 == 0) {
                            for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                              uVar6 = 0;
                              while( true ) {
                                iVar1 = fgetc(__stream);
                                if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                                tmp._data[uVar6] = (char)iVar1;
                                uVar6 = uVar6 + 1;
                              }
                              tmp._data[uVar6] = '\0';
                              C = 0;
                              D = 0;
                              H = 0;
                              W = 0;
                              csiz = 0;
                              iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz
                                                     );
                              if (iVar1 < 4) {
                                pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                pcVar8 = "(FILE*)";
                                if (local_b8 != (char *)0x0) {
                                  pcVar8 = local_b8;
                                }
                                CImgIOException::CImgIOException
                                          (pCVar2,
                                           "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                           ,(ulong)this->_width,(ulong)this->_allocated_width,
                                           this->_data,"unsigned char",(ulong)W,(ulong)H,(ulong)D,
                                           (ulong)C,uVar3,pcVar8);
                                __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                            CImgException::~CImgException);
                              }
                              if (D * C * H * W != 0) {
                                raw._data = (bool *)0x0;
                                raw._width = 0;
                                raw._height = 0;
                                raw._depth = 0;
                                raw._spectrum = 0;
                                raw._is_shared = false;
                                if (iVar1 == 5) {
                                  uVar9 = 0x134945;
                                  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                  pcVar8 = "(FILE*)";
                                  if (local_b8 != (char *)0x0) {
                                    pcVar8 = local_b8;
                                  }
                                  CImgIOException::CImgIOException
                                            (pCVar2,
                                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                             ,(ulong)this->_width,(ulong)this->_allocated_width,
                                             this->_data,"unsigned char",pcVar8);
                                  __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                              CImgException::~CImgException,uVar9);
                                }
                                pCVar7 = this->_data + uVar3;
                                local_a8 = uVar3;
                                CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                                puVar4 = pCVar7->_data;
                                for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                             (ulong)pCVar7->_height * (ulong)pCVar7->_width;
                                    uVar3 != 0; uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                                  uVar6 = 0x1800000;
                                  if (uVar3 < 0x1800000) {
                                    uVar6 = uVar3;
                                  }
                                  CImg<unsigned_long>::assign
                                            ((CImg<unsigned_long> *)&raw,(uint)uVar6,1,1,1);
                                  cimg::fread<unsigned_long>
                                            ((unsigned_long *)raw._data,raw._0_8_ & 0xffffffff,
                                             (FILE *)__stream);
                                  if ((char)local_a0 != '\0') {
                                    cimg::invert_endianness<unsigned_long>
                                              ((unsigned_long *)raw._data,
                                               ((ulong)raw._8_8_ >> 0x20) * (raw._8_8_ & 0xffffffff)
                                               * ((ulong)raw._0_8_ >> 0x20) *
                                                 (raw._0_8_ & 0xffffffff));
                                  }
                                  for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6;
                                      uVar6 = uVar6 + 1) {
                                    puVar4[uVar6] = raw._data[uVar6 * 8];
                                  }
                                  puVar4 = puVar4 + uVar6;
                                }
                                CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)&raw);
                                uVar3 = local_a8;
                              }
                            }
                          }
                          else {
                            iVar1 = cimg::strcasecmp("long",str_pixeltype._data);
                            if (iVar1 == 0) {
                              for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                                uVar6 = 0;
                                while( true ) {
                                  iVar1 = fgetc(__stream);
                                  if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                                  tmp._data[uVar6] = (char)iVar1;
                                  uVar6 = uVar6 + 1;
                                }
                                tmp._data[uVar6] = '\0';
                                C = 0;
                                D = 0;
                                H = 0;
                                W = 0;
                                csiz = 0;
                                iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,
                                                        &csiz);
                                if (iVar1 < 4) {
                                  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                  pcVar8 = "(FILE*)";
                                  if (local_b8 != (char *)0x0) {
                                    pcVar8 = local_b8;
                                  }
                                  CImgIOException::CImgIOException
                                            (pCVar2,
                                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                             ,(ulong)this->_width,(ulong)this->_allocated_width,
                                             this->_data,"unsigned char",(ulong)W,(ulong)H,(ulong)D,
                                             (ulong)C,uVar3,pcVar8);
                                  __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                              CImgException::~CImgException);
                                }
                                if (D * C * H * W != 0) {
                                  raw._data = (bool *)0x0;
                                  raw._width = 0;
                                  raw._height = 0;
                                  raw._depth = 0;
                                  raw._spectrum = 0;
                                  raw._is_shared = false;
                                  if (iVar1 == 5) {
                                    uVar9 = 0x134a96;
                                    pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                    pcVar8 = "(FILE*)";
                                    if (local_b8 != (char *)0x0) {
                                      pcVar8 = local_b8;
                                    }
                                    CImgIOException::CImgIOException
                                              (pCVar2,
                                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                               ,(ulong)this->_width,(ulong)this->_allocated_width,
                                               this->_data,"unsigned char",pcVar8);
                                    __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                                CImgException::~CImgException,uVar9);
                                  }
                                  pCVar7 = this->_data + uVar3;
                                  local_a8 = uVar3;
                                  CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                                  puVar4 = pCVar7->_data;
                                  for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                               (ulong)pCVar7->_height * (ulong)pCVar7->_width;
                                      uVar3 != 0; uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                                    uVar6 = 0x1800000;
                                    if (uVar3 < 0x1800000) {
                                      uVar6 = uVar3;
                                    }
                                    CImg<long>::assign((CImg<long> *)&raw,(uint)uVar6,1,1,1);
                                    cimg::fread<long>((long *)raw._data,raw._0_8_ & 0xffffffff,
                                                      (FILE *)__stream);
                                    if ((char)local_a0 != '\0') {
                                      cimg::invert_endianness<long>
                                                ((long *)raw._data,
                                                 ((ulong)raw._8_8_ >> 0x20) *
                                                 (raw._8_8_ & 0xffffffff) *
                                                 ((ulong)raw._0_8_ >> 0x20) *
                                                 (raw._0_8_ & 0xffffffff));
                                    }
                                    for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6;
                                        uVar6 = uVar6 + 1) {
                                      puVar4[uVar6] = raw._data[uVar6 * 8];
                                    }
                                    puVar4 = puVar4 + uVar6;
                                  }
                                  CImg<long>::~CImg((CImg<long> *)&raw);
                                  uVar3 = local_a8;
                                }
                              }
                            }
                            else {
                              iVar1 = cimg::strcasecmp("float",str_pixeltype._data);
                              if (iVar1 == 0) {
                                for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                                  uVar6 = 0;
                                  while( true ) {
                                    iVar1 = fgetc(__stream);
                                    if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                                    tmp._data[uVar6] = (char)iVar1;
                                    uVar6 = uVar6 + 1;
                                  }
                                  tmp._data[uVar6] = '\0';
                                  C = 0;
                                  D = 0;
                                  H = 0;
                                  W = 0;
                                  csiz = 0;
                                  iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,
                                                          &csiz);
                                  if (iVar1 < 4) {
                                    pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                    pcVar8 = "(FILE*)";
                                    if (local_b8 != (char *)0x0) {
                                      pcVar8 = local_b8;
                                    }
                                    CImgIOException::CImgIOException
                                              (pCVar2,
                                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                               ,(ulong)this->_width,(ulong)this->_allocated_width,
                                               this->_data,"unsigned char",(ulong)W,(ulong)H,
                                               (ulong)D,(ulong)C,uVar3,pcVar8);
                                    __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                                CImgException::~CImgException);
                                  }
                                  if (D * C * H * W != 0) {
                                    raw._data = (bool *)0x0;
                                    raw._width = 0;
                                    raw._height = 0;
                                    raw._depth = 0;
                                    raw._spectrum = 0;
                                    raw._is_shared = false;
                                    if (iVar1 == 5) {
                                      uVar9 = 0x134b79;
                                      pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                      pcVar8 = "(FILE*)";
                                      if (local_b8 != (char *)0x0) {
                                        pcVar8 = local_b8;
                                      }
                                      CImgIOException::CImgIOException
                                                (pCVar2,
                                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                 ,(ulong)this->_width,(ulong)this->_allocated_width,
                                                 this->_data,"unsigned char",pcVar8);
                                      __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                                  CImgException::~CImgException,uVar9);
                                    }
                                    pCVar7 = this->_data + uVar3;
                                    local_a8 = uVar3;
                                    CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                                    puVar4 = pCVar7->_data;
                                    for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                                 (ulong)pCVar7->_height * (ulong)pCVar7->_width;
                                        uVar3 != 0; uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                                      uVar6 = 0x1800000;
                                      if (uVar3 < 0x1800000) {
                                        uVar6 = uVar3;
                                      }
                                      CImg<float>::assign((CImg<float> *)&raw,(uint)uVar6,1,1,1);
                                      cimg::fread<float>((float *)raw._data,raw._0_8_ & 0xffffffff,
                                                         (FILE *)__stream);
                                      if ((char)local_a0 != '\0') {
                                        cimg::invert_endianness<float>
                                                  ((float *)raw._data,
                                                   ((ulong)raw._8_8_ >> 0x20) *
                                                   (raw._8_8_ & 0xffffffff) *
                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                   (raw._0_8_ & 0xffffffff));
                                      }
                                      for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6;
                                          uVar6 = uVar6 + 1) {
                                        puVar4[uVar6] =
                                             (uchar)(int)*(float *)(raw._data + uVar6 * 4);
                                      }
                                      puVar4 = puVar4 + uVar6;
                                    }
                                    CImg<float>::~CImg((CImg<float> *)&raw);
                                    uVar3 = local_a8;
                                  }
                                }
                              }
                              else {
                                iVar1 = cimg::strcasecmp("double",str_pixeltype._data);
                                if (iVar1 != 0) {
                                  if (file == (FILE *)0x0) {
                                    cimg::fclose(__stream);
                                  }
                                  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                  pcVar8 = "(FILE*)";
                                  if (local_b8 != (char *)0x0) {
                                    pcVar8 = local_b8;
                                  }
                                  CImgIOException::CImgIOException
                                            (pCVar2,
                                             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unsupported pixel type \'%s\' for file \'%s\'."
                                             ,(ulong)this->_width,(ulong)this->_allocated_width,
                                             this->_data,"unsigned char",str_pixeltype._data);
                                  goto LAB_00134332;
                                }
                                for (uVar3 = 0; uVar3 < N; uVar3 = uVar3 + 1) {
                                  uVar6 = 0;
                                  while( true ) {
                                    iVar1 = fgetc(__stream);
                                    if (((iVar1 == 10) || (iVar1 < 0)) || (0xfe < uVar6)) break;
                                    tmp._data[uVar6] = (char)iVar1;
                                    uVar6 = uVar6 + 1;
                                  }
                                  tmp._data[uVar6] = '\0';
                                  C = 0;
                                  D = 0;
                                  H = 0;
                                  W = 0;
                                  csiz = 0;
                                  iVar1 = __isoc99_sscanf(tmp._data,"%u %u %u %u #%lu",&W,&H,&D,&C,
                                                          &csiz);
                                  if (iVar1 < 4) {
                                    pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                    pcVar8 = "(FILE*)";
                                    if (local_b8 != (char *)0x0) {
                                      pcVar8 = local_b8;
                                    }
                                    CImgIOException::CImgIOException
                                              (pCVar2,
                                               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                                               ,(ulong)this->_width,(ulong)this->_allocated_width,
                                               this->_data,"unsigned char",(ulong)W,(ulong)H,
                                               (ulong)D,(ulong)C,uVar3,pcVar8);
                                    __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                                CImgException::~CImgException);
                                  }
                                  if (D * C * H * W != 0) {
                                    raw._data = (bool *)0x0;
                                    raw._width = 0;
                                    raw._height = 0;
                                    raw._depth = 0;
                                    raw._spectrum = 0;
                                    raw._is_shared = false;
                                    if (iVar1 == 5) {
                                      uVar9 = 0x134a2f;
                                      pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                      pcVar8 = "(FILE*)";
                                      if (local_b8 != (char *)0x0) {
                                        pcVar8 = local_b8;
                                      }
                                      CImgIOException::CImgIOException
                                                (pCVar2,
                                                 "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                                                 ,(ulong)this->_width,(ulong)this->_allocated_width,
                                                 this->_data,"unsigned char",pcVar8);
                                      __cxa_throw(pCVar2,&CImgIOException::typeinfo,
                                                  CImgException::~CImgException,uVar9);
                                    }
                                    pCVar7 = this->_data + uVar3;
                                    local_a8 = uVar3;
                                    CImg<unsigned_char>::assign(pCVar7,W,H,D,C);
                                    puVar4 = pCVar7->_data;
                                    for (uVar3 = (ulong)pCVar7->_spectrum * (ulong)pCVar7->_depth *
                                                 (ulong)pCVar7->_height * (ulong)pCVar7->_width;
                                        uVar3 != 0; uVar3 = uVar3 - (raw._0_8_ & 0xffffffff)) {
                                      uVar6 = 0x1800000;
                                      if (uVar3 < 0x1800000) {
                                        uVar6 = uVar3;
                                      }
                                      CImg<double>::assign((CImg<double> *)&raw,(uint)uVar6,1,1,1);
                                      cimg::fread<double>((double *)raw._data,raw._0_8_ & 0xffffffff
                                                          ,(FILE *)__stream);
                                      if ((char)local_a0 != '\0') {
                                        cimg::invert_endianness<double>
                                                  ((double *)raw._data,
                                                   ((ulong)raw._8_8_ >> 0x20) *
                                                   (raw._8_8_ & 0xffffffff) *
                                                   ((ulong)raw._0_8_ >> 0x20) *
                                                   (raw._0_8_ & 0xffffffff));
                                      }
                                      for (uVar6 = 0; (raw._0_8_ & 0xffffffff) != uVar6;
                                          uVar6 = uVar6 + 1) {
                                        puVar4[uVar6] =
                                             (uchar)(int)*(double *)(raw._data + uVar6 * 8);
                                      }
                                      puVar4 = puVar4 + uVar6;
                                    }
                                    CImg<double>::~CImg((CImg<double> *)&raw);
                                    uVar3 = local_a8;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    CImg<char>::~CImg(&str_endian);
    CImg<char>::~CImg(&str_pixeltype);
    CImg<char>::~CImg(&tmp);
    return this;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(__stream);
  }
  pcVar8 = (char *)0x1342ee;
  pCVar2 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar5 = "(FILE*)";
  if (local_b8 != (char *)0x0) {
    pcVar5 = local_b8;
  }
  CImgIOException::CImgIOException
            (pCVar2,
             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): CImg header not found in file \'%s\'."
             ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",pcVar5);
LAB_00134332:
  __cxa_throw(pCVar2,&CImgIOException::typeinfo,CImgException::~CImgException,pcVar8);
}

Assistant:

CImgList<T>& _load_cimg(std::FILE *const file, const char *const filename) {
#ifdef cimg_use_zlib
#define _cimgz_load_cimg_case(Tss) { \
   Bytef *const cbuf = new Bytef[csiz]; \
   cimg::fread(cbuf,csiz,nfile); \
   raw.assign(W,H,D,C); \
   unsigned long destlen = (unsigned long)raw.size()*sizeof(Tss); \
   uncompress((Bytef*)raw._data,&destlen,cbuf,csiz); \
   delete[] cbuf; \
   if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
   raw.move_to(img); \
}
#else
#define _cimgz_load_cimg_case(Tss) \
   throw CImgIOException(_cimglist_instance \
                         "load_cimg(): Unable to load compressed data from file '%s' unless zlib is enabled.", \
                         cimglist_instance, \
                         filename?filename:"(FILE*)");
#endif

#define _cimg_load_cimg_case(Ts,Tss) \
      if (!loaded && !cimg::strcasecmp(Ts,str_pixeltype)) { \
        for (unsigned int l = 0; l<N; ++l) { \
          j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0; \
          W = H = D = C = 0; csiz = 0; \
          if ((err = cimg_sscanf(tmp,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz))<4) \
            throw CImgIOException(_cimglist_instance \
                                  "load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file '%s'.", \
                                  cimglist_instance, \
                                  W,H,D,C,l,filename?filename:("(FILE*)")); \
          if (W*H*D*C>0) { \
            CImg<Tss> raw; \
            CImg<T> &img = _data[l]; \
            if (err==5) _cimgz_load_cimg_case(Tss) \
            else { \
              img.assign(W,H,D,C); \
              T *ptrd = img._data; \
              for (unsigned long to_read = img.size(); to_read; ) { \
                raw.assign(cimg::min(to_read,cimg_iobuffer)); \
                cimg::fread(raw._data,raw._width,nfile); \
                if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
                const Tss *ptrs = raw._data; \
                for (unsigned long off = (unsigned long)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++); \
                to_read-=raw._width; \
              } \
            } \
          } \
        } \
        loaded = true; \
      }

      if (!filename && !file)
        throw CImgArgumentException(_cimglist_instance
                                    "load_cimg(): Specified filename is (null).",
                                    cimglist_instance);

      const unsigned long cimg_iobuffer = 24*1024*1024;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      bool loaded = false, endian = cimg::endianness();
      CImg<charT> tmp(256), str_pixeltype(256), str_endian(256);
      *tmp = *str_pixeltype = *str_endian = 0;
      unsigned int j, N = 0, W, H, D, C;
      unsigned long csiz;
      int i, err;
      do {
        j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0;
      } while (*tmp=='#' && i>=0);
      err = cimg_sscanf(tmp,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",
                        &N,str_pixeltype._data,str_endian._data);
      if (err<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): CImg header not found in file '%s'.",
                              cimglist_instance,
                              filename?filename:"(FILE*)");
      }
      if (!cimg::strncasecmp("little",str_endian,6)) endian = false;
      else if (!cimg::strncasecmp("big",str_endian,3)) endian = true;
      assign(N);
      _cimg_load_cimg_case("bool",bool);
      _cimg_load_cimg_case("unsigned_char",unsigned char);
      _cimg_load_cimg_case("uchar",unsigned char);
      _cimg_load_cimg_case("char",char);
      _cimg_load_cimg_case("unsigned_short",unsigned short);
      _cimg_load_cimg_case("ushort",unsigned short);
      _cimg_load_cimg_case("short",short);
      _cimg_load_cimg_case("unsigned_int",unsigned int);
      _cimg_load_cimg_case("uint",unsigned int);
      _cimg_load_cimg_case("int",int);
      _cimg_load_cimg_case("unsigned_long",unsigned long);
      _cimg_load_cimg_case("ulong",unsigned long);
      _cimg_load_cimg_case("long",long);
      _cimg_load_cimg_case("float",float);
      _cimg_load_cimg_case("double",double);

      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): Unsupported pixel type '%s' for file '%s'.",
                              cimglist_instance,
                              str_pixeltype._data,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }